

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_Order_Test::TestBody(PKCS12Test_Order_Test *this)

{
  pointer *ppuVar1;
  AssertionResult *pAVar2;
  UniquePtr<EVP_PKEY> UVar3;
  UniquePtr<X509> UVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  long *plVar8;
  char *in_R9;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> in_03;
  Span<const_unsigned_char> in_04;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  AssertHelper AStack_c8;
  AssertionResult gtest_ar__7;
  string local_b0;
  AssertionResult gtest_ar__10;
  UniquePtr<EVP_PKEY> key1;
  UniquePtr<X509> cert3;
  UniquePtr<X509> cert2;
  UniquePtr<X509> cert1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> p12;
  UniquePtr<X509> cert1b;
  UniquePtr<EVP_PKEY> key3;
  UniquePtr<EVP_PKEY> key2;
  
  MakeTestKey();
  ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
                         key1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                         (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0);
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&p12,(AssertionResult *)0x49efa9,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x231,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    std::__cxx11::string::~string((string *)&local_b0);
    if (gtest_ar__10._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppuVar1);
    goto LAB_002fe618;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppuVar1);
  MakeTestCert((EVP_PKEY *)&cert1);
  ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                         cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0);
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&p12,(AssertionResult *)"cert1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x233,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    std::__cxx11::string::~string((string *)&local_b0);
    if (gtest_ar__10._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppuVar1);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppuVar1);
    MakeTestCert((EVP_PKEY *)&cert1b);
    ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                           cert1b._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0);
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        cert1b._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&gtest_ar__10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b0,(internal *)&p12,(AssertionResult *)"cert1b","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x235,local_b0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
      std::__cxx11::string::~string((string *)&local_b0);
      if (gtest_ar__10._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)ppuVar1);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)ppuVar1);
      MakeTestKey();
      ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
                             key2._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                             (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0);
      if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
          key2._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b0,(internal *)&p12,(AssertionResult *)0x4ad753,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x237,local_b0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
        std::__cxx11::string::~string((string *)&local_b0);
        if (gtest_ar__10._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppuVar1);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppuVar1);
        MakeTestCert((EVP_PKEY *)&cert2);
        ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                               cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0);
        if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
            cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&gtest_ar__10);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b0,(internal *)&p12,(AssertionResult *)"cert2","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x239,local_b0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
          std::__cxx11::string::~string((string *)&local_b0);
          if (gtest_ar__10._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppuVar1);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppuVar1);
          MakeTestKey();
          ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(p12.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
                                 key3._M_t.
                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                                 (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0);
          if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
              key3._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&gtest_ar__10);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_b0,(internal *)&p12,(AssertionResult *)"key3","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x23b,local_b0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
            std::__cxx11::string::~string((string *)&local_b0);
            if (gtest_ar__10._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ppuVar1);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ppuVar1);
            MakeTestCert((EVP_PKEY *)&cert3);
            ppuVar1 = &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish;
            p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(p12.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                                   cert3._M_t.
                                   super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                                   (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0);
            if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&gtest_ar__10);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_b0,(internal *)&p12,(AssertionResult *)"cert3","false","true",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x23d,local_b0._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__10);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
              std::__cxx11::string::~string((string *)&local_b0);
              if (gtest_ar__10._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)ppuVar1);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)ppuVar1);
              UVar3 = key1;
              p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              gtest_ar__10._0_8_ =
                   cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              gtest_ar__10.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l._M_len = 3;
              __l._M_array = (iterator)&gtest_ar__10;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l,
                         (allocator_type *)&AStack_c8);
              bVar7 = PKCS12CreateVector(&p12,(EVP_PKEY *)
                                              UVar3._M_t.
                                              super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_evp_pkey_st_*,_false>.
                                              _M_head_impl,
                                         (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0)
              ;
              gtest_ar__7.success_ = bVar7;
              gtest_ar__7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
              if (gtest_ar__7.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__10);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_b0,(internal *)&gtest_ar__7,
                           (AssertionResult *)
                           "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert2.get(), cert3.get()})"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x242,local_b0._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar__10);
LAB_002fe59f:
                pAVar2 = &gtest_ar__7;
                testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
                std::__cxx11::string::~string((string *)&local_b0);
                plVar8 = (long *)gtest_ar__10._0_8_;
LAB_002fe5b6:
                if (plVar8 != (long *)0x0) {
                  (**(code **)(*plVar8 + 8))();
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&pAVar2->message_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__7.message_);
                puVar6 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar5 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                UVar4 = cert1;
                UVar3 = key1;
                gtest_ar__10._0_8_ =
                     cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_00._M_len = 2;
                __l_00._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_00,
                           (allocator_type *)&gtest_ar__7);
                in.size_ = (long)puVar6 - (long)puVar5;
                in.data_ = puVar5;
                ExpectPKCS12Parse(in,(EVP_PKEY *)
                                     UVar3._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                  (X509 *)UVar4._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                UVar3 = key1;
                gtest_ar__10._0_8_ =
                     cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_01._M_len = 3;
                __l_01._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_01,
                           (allocator_type *)&AStack_c8);
                bVar7 = PKCS12CreateVector(&p12,(EVP_PKEY *)
                                                UVar3._M_t.
                                                super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_evp_pkey_st_*,_false>.
                                                _M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b0);
                gtest_ar__7.success_ = bVar7;
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                if (gtest_ar__7.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__10);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b0,(internal *)&gtest_ar__7,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert3.get(), cert1.get(), cert2.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x246,local_b0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar__10);
                  goto LAB_002fe59f;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__7.message_);
                puVar6 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar5 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                UVar4 = cert1;
                UVar3 = key1;
                gtest_ar__10._0_8_ =
                     cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_02._M_len = 2;
                __l_02._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_02,
                           (allocator_type *)&gtest_ar__7);
                in_00.size_ = (long)puVar6 - (long)puVar5;
                in_00.data_ = puVar5;
                ExpectPKCS12Parse(in_00,(EVP_PKEY *)
                                        UVar3._M_t.
                                        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                  (X509 *)UVar4._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                UVar3 = key1;
                gtest_ar__10._0_8_ =
                     cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_03._M_len = 3;
                __l_03._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_03,
                           (allocator_type *)&AStack_c8);
                bVar7 = PKCS12CreateVector(&p12,(EVP_PKEY *)
                                                UVar3._M_t.
                                                super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_evp_pkey_st_*,_false>.
                                                _M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b0);
                gtest_ar__7.success_ = bVar7;
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                if (gtest_ar__7.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__10);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b0,(internal *)&gtest_ar__7,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get(), cert1.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x24a,local_b0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar__10);
                  goto LAB_002fe59f;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__7.message_);
                puVar6 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar5 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                UVar4 = cert1;
                UVar3 = key1;
                gtest_ar__10._0_8_ =
                     cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_04._M_len = 2;
                __l_04._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_04,
                           (allocator_type *)&gtest_ar__7);
                in_01.size_ = (long)puVar6 - (long)puVar5;
                in_01.data_ = puVar5;
                ExpectPKCS12Parse(in_01,(EVP_PKEY *)
                                        UVar3._M_t.
                                        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                  (X509 *)UVar4._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                UVar3 = key1;
                gtest_ar__7._0_8_ =
                     cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert1b._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_05._M_len = 2;
                __l_05._M_array = (iterator)&gtest_ar__7;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_05,
                           (allocator_type *)&AStack_c8);
                bVar7 = PKCS12CreateVector(&p12,(EVP_PKEY *)
                                                UVar3._M_t.
                                                super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_evp_pkey_st_*,_false>.
                                                _M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b0);
                gtest_ar__10.success_ = bVar7;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                if (gtest_ar__10.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__7);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b0,(internal *)&gtest_ar__10,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()})",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x250,local_b0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar__7);
LAB_002fe688:
                  pAVar2 = &gtest_ar__10;
                  testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
                  std::__cxx11::string::~string((string *)&local_b0);
                  plVar8 = (long *)gtest_ar__7._0_8_;
                  goto LAB_002fe5b6;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__10.message_);
                puVar6 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar5 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                UVar3 = key1;
                gtest_ar__10._0_8_ =
                     cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_06._M_len = 1;
                __l_06._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_06,
                           (allocator_type *)&gtest_ar__7);
                in_02.size_ = (long)puVar6 - (long)puVar5;
                in_02.data_ = puVar5;
                ExpectPKCS12Parse(in_02,(EVP_PKEY *)
                                        UVar3._M_t.
                                        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                  (X509 *)cert1b._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                gtest_ar__10._0_8_ =
                     cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_07._M_len = 3;
                __l_07._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_07,
                           (allocator_type *)&AStack_c8);
                bVar7 = PKCS12CreateVector(&p12,(EVP_PKEY *)0x0,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b0);
                gtest_ar__7.success_ = bVar7;
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                if (gtest_ar__7.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__10);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b0,(internal *)&gtest_ar__7,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, nullptr, {cert1.get(), cert2.get(), cert3.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x255,local_b0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar__10);
                  goto LAB_002fe59f;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__7.message_);
                puVar6 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar5 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                gtest_ar__10._0_8_ =
                     cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_08._M_len = 3;
                __l_08._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_08,
                           (allocator_type *)&gtest_ar__7);
                in_03.size_ = (long)puVar6 - (long)puVar5;
                in_03.data_ = puVar5;
                ExpectPKCS12Parse(in_03,(EVP_PKEY *)0x0,(X509 *)0x0,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                UVar3 = key1;
                gtest_ar__7._0_8_ =
                     cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_09._M_len = 2;
                __l_09._M_array = (iterator)&gtest_ar__7;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_09,
                           (allocator_type *)&AStack_c8);
                bVar7 = PKCS12CreateVector(&p12,(EVP_PKEY *)
                                                UVar3._M_t.
                                                super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_evp_pkey_st_*,_false>.
                                                _M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b0);
                gtest_ar__10.success_ = bVar7;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                if (gtest_ar__10.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__7);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b0,(internal *)&gtest_ar__10,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()})",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x25a,local_b0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar__7);
                  goto LAB_002fe688;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__10.message_);
                puVar6 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar5 = p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                gtest_ar__10._0_8_ =
                     cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )cert3._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_10._M_len = 2;
                __l_10._M_array = (iterator)&gtest_ar__10;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0,__l_10,
                           (allocator_type *)&gtest_ar__7);
                in_04.size_ = (long)puVar6 - (long)puVar5;
                in_04.data_ = puVar5;
                ExpectPKCS12Parse(in_04,(EVP_PKEY *)
                                        key1._M_t.
                                        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                  (X509 *)0x0,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b0);
              }
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert3);
          }
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key3);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert2);
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key2);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert1b);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert1);
LAB_002fe618:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key1);
  return;
}

Assistant:

TEST(PKCS12Test, Order) {
  bssl::UniquePtr<EVP_PKEY> key1 = MakeTestKey();
  ASSERT_TRUE(key1);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert1b = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1b);
  bssl::UniquePtr<EVP_PKEY> key2 = MakeTestKey();
  ASSERT_TRUE(key2);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key2.get());
  ASSERT_TRUE(cert2);
  bssl::UniquePtr<EVP_PKEY> key3 = MakeTestKey();
  ASSERT_TRUE(key3);
  bssl::UniquePtr<X509> cert3 = MakeTestCert(key3.get());
  ASSERT_TRUE(cert3);

  // PKCS12_parse uses the key to select the main certificate.
  std::vector<uint8_t> p12;
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert3.get(), cert1.get(), cert2.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert3.get(), cert2.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert2.get(), cert3.get(), cert1.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  // In case of duplicates, the last one is selected. (It is unlikely anything
  // depends on which is selected, but we match OpenSSL.)
  ASSERT_TRUE(
      PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1b.get(), {cert1.get()});

  // If there is no key, all certificates are returned as "CA" certificates.
  ASSERT_TRUE(PKCS12CreateVector(&p12, nullptr,
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, nullptr, nullptr,
                    {cert1.get(), cert2.get(), cert3.get()});

  // The same happens if there is a key, but it does not match any certificate.
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), nullptr, {cert2.get(), cert3.get()});
}